

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SizedPtr __thiscall google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this)

{
  SerialArenaChunk *pSVar1;
  SerialArena *this_00;
  undefined8 *puVar2;
  SerialArenaChunk *this_01;
  undefined8 *puVar3;
  ulong uVar4;
  void *pvVar5;
  string *psVar6;
  string *extraout_RAX;
  undefined1 *puVar7;
  long lVar8;
  GetDeallocator deallocator;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar9;
  SizedPtr SVar10;
  undefined1 local_40 [16];
  
  uVar4 = (this->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar4 == 0) {
    deallocator.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    deallocator.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar4 + 0x18);
  }
  this_01 = (this->head_)._M_b._M_p;
  do {
    if (((ulong)this_01 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                   );
    }
    if (*(int *)(this_01 + 8) == 0) {
      SVar10 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                         (&this->first_arena_,deallocator);
      return SVar10;
    }
    pSVar1 = *(SerialArenaChunk **)this_01;
    SVar9 = SerialArenaChunk::arenas(this_01);
    if (SVar9.len_ != 0) {
      lVar8 = SVar9.len_ << 3;
      do {
        this_00 = *(SerialArena **)((long)&SVar9.ptr_[-1]._M_b._M_p + lVar8);
        if (this_00 == (SerialArena *)0x0) {
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                             ((void *)0x0,(void *)0x0,"serial != nullptr");
        }
        else {
          psVar6 = (string *)0x0;
        }
        if (psVar6 != (string *)0x0) {
          Free();
          psVar6 = extraout_RAX;
LAB_00133b68:
          puVar7 = local_40;
          Free();
          if (*(StringBlock **)(puVar7 + 0x38) != (StringBlock *)0x0) {
            SerialArena::FreeStringBlocks
                      (*(StringBlock **)(puVar7 + 0x38),*(size_t *)(puVar7 + 0x40));
          }
          puVar2 = *(undefined8 **)(puVar7 + 0x48);
          uVar4 = puVar2[1];
          for (puVar3 = (undefined8 *)*puVar2; puVar3 != (undefined8 *)0x0;
              puVar3 = (undefined8 *)*puVar3) {
            if (psVar6 == (string *)0x0) {
              operator_delete(puVar2,uVar4);
            }
            else {
              (*(code *)psVar6)();
            }
            uVar4 = puVar3[1];
            puVar2 = puVar3;
          }
          SVar10.n = uVar4;
          SVar10.p = puVar2;
          return SVar10;
        }
        SVar10 = SerialArena::
                 Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                           (this_00,deallocator);
        pvVar5 = SVar10.p;
        if (pvVar5 == (void *)0x0) {
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                             ((void *)0x0,(void *)0x0,"mem.p != nullptr");
        }
        else {
          psVar6 = (string *)0x0;
        }
        if (psVar6 != (string *)0x0) goto LAB_00133b68;
        if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
          operator_delete(pvVar5,SVar10.n);
        }
        else {
          (*deallocator.dealloc_)(pvVar5,SVar10.n);
        }
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
    }
    operator_delete(this_01,(ulong)*(uint *)(this_01 + 8) * 0x10 + 0x10);
    this_01 = pSVar1;
  } while( true );
}

Assistant:

ArenaBlock* SentryArenaBlock() {
  static const ArenaBlock kSentryArenaBlock;
  // const_cast<> is okay as kSentryArenaBlock will never be mutated.
  return const_cast<ArenaBlock*>(&kSentryArenaBlock);
}